

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_segment.cpp
# Opt level: O2

void __thiscall duckdb::TupleDataSegment::Unpin(TupleDataSegment *this)

{
  ::std::mutex::lock(&this->pinned_handles_lock);
  ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::clear
            (&(this->pinned_row_handles).
              super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>);
  ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::clear
            (&(this->pinned_heap_handles).
              super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>);
  pthread_mutex_unlock((pthread_mutex_t *)&this->pinned_handles_lock);
  return;
}

Assistant:

void TupleDataSegment::Unpin() {
	lock_guard<mutex> guard(pinned_handles_lock);
	pinned_row_handles.clear();
	pinned_heap_handles.clear();
}